

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  float local_cc;
  ImVec2 *local_b0;
  unsigned_short *local_a8;
  byte local_9d;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  int local_7c;
  int n;
  ImVec2 triangle [3];
  uint idx_n;
  ImDrawListFlags backup_flags;
  ImRect vtxs_rect;
  ImRect clip_rect;
  ImDrawVert *vtx_buffer;
  ImDrawIdx *idx_buffer;
  bool show_aabb_local;
  bool show_mesh_local;
  ImDrawCmd *draw_cmd_local;
  ImDrawList *draw_list_local;
  ImDrawList *out_draw_list_local;
  
  local_9d = 1;
  if (!show_mesh) {
    local_9d = show_aabb;
  }
  if ((local_9d & 1) != 0) {
    if ((draw_list->IdxBuffer).Size < 1) {
      local_a8 = (unsigned_short *)0x0;
    }
    else {
      local_a8 = (draw_list->IdxBuffer).Data;
    }
    clip_rect.Max = (ImVec2)((draw_list->VtxBuffer).Data + draw_cmd->VtxOffset);
    ImRect::ImRect((ImRect *)&vtxs_rect.Max,&draw_cmd->ClipRect);
    ImRect::ImRect((ImRect *)&idx_n,3.4028235e+38,3.4028235e+38,-3.4028235e+38,-3.4028235e+38);
    triangle[2].y = (float)out_draw_list->Flags;
    out_draw_list->Flags = out_draw_list->Flags & 0xfffffffe;
    triangle[2].x = (float)draw_cmd->IdxOffset;
    while ((uint)triangle[2].x < draw_cmd->IdxOffset + draw_cmd->ElemCount) {
      local_b0 = (ImVec2 *)&stack0xffffffffffffff88;
      do {
        ImVec2::ImVec2(local_b0);
        local_b0 = local_b0 + 1;
      } while (local_b0 != triangle + 2);
      for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
        if (local_a8 == (unsigned_short *)0x0) {
          local_cc = triangle[2].x;
        }
        else {
          local_cc = (float)(uint)local_a8[(uint)triangle[2].x];
        }
        *(undefined8 *)(&stack0xffffffffffffff88 + (long)local_7c * 8) =
             *(undefined8 *)((long)clip_rect.Max + (ulong)(uint)local_cc * 0x14);
        ImRect::Add((ImRect *)&idx_n,(ImVec2 *)(&stack0xffffffffffffff88 + (long)local_7c * 8));
        triangle[2].x = (float)((int)triangle[2].x + 1);
      }
      if (show_mesh) {
        ImDrawList::AddPolyline(out_draw_list,(ImVec2 *)&stack0xffffffffffffff88,3,0xff00ffff,1,1.0)
        ;
      }
    }
    if (show_aabb) {
      local_84 = ImFloor(&vtxs_rect.Max);
      local_8c = ImFloor(&clip_rect.Min);
      ImDrawList::AddRect(out_draw_list,&local_84,&local_8c,0xffff00ff,0.0,0,1.0);
      local_94 = ImFloor((ImVec2 *)&idx_n);
      local_9c = ImFloor(&vtxs_rect.Min);
      ImDrawList::AddRect(out_draw_list,&local_94,&local_9c,0xffffff00,0.0,0,1.0);
    }
    out_draw_list->Flags = (ImDrawListFlags)triangle[2].y;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x2c9f,
                "void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, bool, bool)"
               );
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}